

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::get_gold_actions
               (search *sch,uint32_t idx,uint64_t param_3,v_array<unsigned_int> *gold_actions)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  undefined8 in_RAX;
  ulong uVar9;
  ulong uVar10;
  uint *new_ele;
  ulong uVar11;
  undefined8 uStack_38;
  
  pvVar5 = sch->task_data;
  uStack_38 = in_RAX;
  v_array<unsigned_int>::clear(gold_actions);
  lVar6 = *(long *)((long)pvVar5 + 0xa0);
  if (lVar6 == *(long *)((long)pvVar5 + 0x98)) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ulong)*(uint *)(lVar6 + -4);
  }
  if (*(int *)((long)pvVar5 + 0x2c4) == 1) {
    lVar7 = *(long *)((long)pvVar5 + 0x18);
    uVar10 = *(long *)((long)pvVar5 + 0x20) - lVar7 >> 2;
    uVar11 = 0xffffffffffffffff;
    do {
      if (-uVar10 + uVar11 == -1) goto LAB_00231606;
      uVar1 = uVar11 + 1;
      lVar2 = uVar11 * 4;
      uVar11 = uVar1;
    } while (*(int *)(lVar7 + 4 + lVar2) != 1);
    if ((uVar1 < uVar10) &&
       ((lVar6 == *(long *)((long)pvVar5 + 0x98) ||
        ((int)uVar9 == *(int *)(*(long *)((long)pvVar5 + 0x58) + (ulong)idx * 4))))) {
      new_ele = &SHIFT;
    }
    else {
LAB_00231606:
      uVar11 = 0xffffffffffffffff;
      do {
        if (-uVar10 + uVar11 == -1) goto LAB_0023164c;
        uVar1 = uVar11 + 1;
        lVar6 = uVar11 * 4;
        uVar11 = uVar1;
      } while (*(int *)(lVar7 + 4 + lVar6) != 3);
      if ((uVar10 <= uVar1) || (*(uint32_t *)(*(long *)((long)pvVar5 + 0x58) + uVar9 * 4) != idx))
      goto LAB_0023164c;
      new_ele = &REDUCE_LEFT;
    }
    v_array<unsigned_int>::push_back(gold_actions,new_ele);
    return;
  }
LAB_0023164c:
  uVar9 = 1;
  uVar8 = 1;
  do {
    uStack_38 = CONCAT44(uVar8,(undefined4)uStack_38);
    if (4 < uVar8) {
      return;
    }
    if ((uVar8 != 4) || (*(int *)((long)pvVar5 + 0x2c4) != 1)) {
      uVar3 = *(uint *)(*(long *)((long)pvVar5 + 0x38) + (ulong)uVar8 * 4);
      uVar4 = *(uint *)(*(long *)((long)pvVar5 + 0x38) + uVar9 * 4);
      if (uVar3 < uVar4) {
        uVar10 = *(long *)((long)pvVar5 + 0x20) - *(long *)((long)pvVar5 + 0x18) >> 2;
        uVar11 = 0xffffffffffffffff;
        do {
          if (uVar11 - uVar10 == -1) goto LAB_002316cf;
          uVar1 = uVar11 + 1;
          lVar6 = uVar11 * 4;
          uVar11 = uVar1;
        } while (*(uint *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar6) != uVar8);
        if (uVar10 <= uVar1) goto LAB_002316cf;
        v_array<unsigned_int>::clear(gold_actions);
        uVar9 = (ulong)uVar8;
LAB_00231707:
        v_array<unsigned_int>::push_back(gold_actions,(uint *)((long)&uStack_38 + 4));
      }
      else {
LAB_002316cf:
        if (uVar3 == uVar4) {
          uVar10 = *(long *)((long)pvVar5 + 0x20) - *(long *)((long)pvVar5 + 0x18) >> 2;
          uVar11 = 0xffffffffffffffff;
          do {
            if (uVar11 - uVar10 == -1) goto LAB_00231712;
            uVar1 = uVar11 + 1;
            lVar6 = uVar11 * 4;
            uVar11 = uVar1;
          } while (*(uint *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar6) != uVar8);
          if (uVar1 < uVar10) goto LAB_00231707;
        }
      }
    }
LAB_00231712:
    uVar8 = uStack_38._4_4_ + 1;
  } while( true );
}

Assistant:

void get_gold_actions(Search::search &sch, uint32_t idx, uint64_t /* n */, v_array<action> &gold_actions)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads,
                    &valid_actions = data->valid_actions;
  gold_actions.clear();
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();
  uint32_t &sys = data->transition_system;

  if (sys == arc_hybrid && is_valid(SHIFT, valid_actions) && (stack.empty() || gold_heads[idx] == last))
  {
    gold_actions.push_back(SHIFT);
    return;
  }

  if (sys == arc_hybrid && is_valid(REDUCE_LEFT, valid_actions) && gold_heads[last] == idx)
  {
    gold_actions.push_back(REDUCE_LEFT);
    return;
  }
  size_t best_action = 1;
  size_t count = 0;
  for (uint32_t i = 1; i <= 4; i++)
  {
    if (i == 4 && sys == arc_hybrid)
      continue;
    if (action_loss[i] < action_loss[best_action] && is_valid(i, valid_actions))
    {
      best_action = i;
      count = 1;
      gold_actions.clear();
      gold_actions.push_back(i);
    }
    else if (action_loss[i] == action_loss[best_action] && is_valid(i, valid_actions))
    {
      count++;
      gold_actions.push_back(i);
    }
  }
}